

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  AInventory *pAVar4;
  char *pcVar5;
  AActor *this;
  bool bVar6;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042cd52;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042cd39:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042cd52:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x417,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_0042cc52;
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar6 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar3 && bVar6) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar6 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar3) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042cd52;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_0042cd39;
LAB_0042cc52:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042cd7a;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0042cd42:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042cd7a;
  }
  pAVar4 = (AInventory *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (pAVar4 == (AInventory *)0x0) goto LAB_0042cc85;
  }
  else {
    if (pAVar4 != (AInventory *)0x0) goto LAB_0042cd42;
LAB_0042cc85:
    NullParam("\"item\"");
    pAVar4 = (AInventory *)param[1].field_0.field_1.a;
    if (pAVar4 == (AInventory *)0x0) {
      pAVar4 = (AInventory *)0x0;
      goto LAB_0042ccfd;
    }
  }
  pPVar2 = AInventory::RegistrationInfo.MyClass;
  pPVar3 = (pAVar4->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar1 = (**(pAVar4->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar4);
    pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
    (pAVar4->super_AActor).super_DThinker.super_DObject.Class = pPVar3;
  }
  bVar6 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar2 && bVar6) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar6 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar2) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar6) {
    pcVar5 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_0042cd7a:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x418,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_0042ccfd:
  pAVar4 = AActor::DropInventory(this,pAVar4);
  if (numret < 1) {
    iVar1 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x419,
                    "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = 1;
    VMReturn::SetPointer(ret,pAVar4,1);
  }
  return iVar1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_OBJECT(self->DropInventory(item));
}